

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O2

problem * baryonyx::unpreprocess(problem *__return_storage_ptr__,context *ctx,raw_problem *raw_pb)

{
  size_t size;
  tuple<double,_baryonyx::show_size_type> *mem;
  string sStack_58;
  baryonyx local_38 [16];
  
  size = memory_consumed(raw_pb);
  memory_consumed_size<unsigned_long>(size);
  to_string_abi_cxx11_(&sStack_58,local_38,mem);
  info<std::__cxx11::string>(ctx,"- Unprepossessing starts (size: {})\n",&sStack_58);
  std::__cxx11::string::~string((string *)&sStack_58);
  problem::problem(__return_storage_ptr__,raw_pb);
  return __return_storage_ptr__;
}

Assistant:

problem
unpreprocess(const context& ctx, const raw_problem& raw_pb)
{
    info(ctx,
         "- Unprepossessing starts (size: {})\n",
         to_string(memory_consumed_size(memory_consumed(raw_pb))));

    return problem(raw_pb);
}